

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall Json::Value::setComment(Value *this,String *comment,CommentPlacement placement)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OStringStream oss;
  String local_1d8;
  String local_1b8;
  ostringstream local_198 [376];
  
  if ((comment->_M_string_length != 0) &&
     ((comment->_M_dataplus)._M_p[comment->_M_string_length - 1] == '\n')) {
    std::__cxx11::string::pop_back();
  }
  local_1d8._M_string_length = comment->_M_string_length;
  if ((local_1d8._M_string_length != 0) && (*(comment->_M_dataplus)._M_p != '/')) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"in Json::Value::setComment(): Comments must start with /",0x38)
    ;
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1b8);
  }
  local_1d8._M_dataplus._M_p = (comment->_M_dataplus)._M_p;
  paVar1 = &comment->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p == paVar1) {
    local_1d8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_1d8.field_2._8_8_ = *(undefined8 *)((long)&comment->field_2 + 8);
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  }
  else {
    local_1d8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (comment->_M_dataplus)._M_p = (pointer)paVar1;
  comment->_M_string_length = 0;
  (comment->field_2)._M_local_buf[0] = '\0';
  Comments::set(&this->comments_,placement,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Value::setComment(String comment, CommentPlacement placement) {
  if (!comment.empty() && (comment.back() == '\n')) {
    // Always discard trailing newline, to aid indentation.
    comment.pop_back();
  }
  JSON_ASSERT_MESSAGE(
      comment.empty() || comment[0] == '/',
      "in Json::Value::setComment(): Comments must start with /");
  comments_.set(placement, std::move(comment));
}